

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O1

Vec_Str_t * Pla_ReadPlaBody(char *pBuffer,char *pLimit,Pla_File_t Type)

{
  uint uVar1;
  Vec_Str_t *pVVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  size_t __size;
  
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  pVVar2->nCap = 10000;
  pVVar2->nSize = 0;
  pcVar3 = (char *)malloc(10000);
  pVVar2->pArray = pcVar3;
  if (pBuffer < pLimit) {
    do {
      if (*pBuffer == '.') {
        for (; (*pBuffer != '\0' && (*pBuffer != '\n')); pBuffer = pBuffer + 1) {
        }
      }
      switch(*pBuffer) {
      case '-':
      case '2':
switchD_003ff5bc_caseD_2d:
        uVar1 = pVVar2->nCap;
        uVar5 = pVVar2->nSize;
        if (uVar5 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar2->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(0x10);
            }
            else {
              pcVar3 = (char *)realloc(pVVar2->pArray,0x10);
            }
            __size = 0x10;
          }
          else {
            __size = (ulong)uVar1 * 2;
            if ((int)__size <= (int)uVar1) goto LAB_003ff6a6;
            if (pVVar2->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(__size);
            }
            else {
              pcVar3 = (char *)realloc(pVVar2->pArray,__size);
            }
          }
          cVar4 = '\0';
LAB_003ff7a1:
          pVVar2->pArray = pcVar3;
          pVVar2->nCap = (int)__size;
        }
        else {
LAB_003ff6a6:
          cVar4 = '\0';
        }
        break;
      case '.':
      case '/':
        goto switchD_003ff5bc_caseD_2e;
      case '0':
switchD_003ff5bc_caseD_30:
        uVar1 = pVVar2->nCap;
        uVar5 = pVVar2->nSize;
        cVar4 = '\x01';
        if (uVar5 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar2->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(0x10);
            }
            else {
              pcVar3 = (char *)realloc(pVVar2->pArray,0x10);
            }
            cVar4 = '\x01';
LAB_003ff783:
            __size = 0x10;
            goto LAB_003ff7a1;
          }
          __size = (ulong)uVar1 * 2;
          if ((int)uVar1 < (int)__size) {
            if (pVVar2->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(__size);
            }
            else {
              pcVar3 = (char *)realloc(pVVar2->pArray,__size);
            }
            cVar4 = '\x01';
            goto LAB_003ff7a1;
          }
        }
        break;
      case '1':
        uVar1 = pVVar2->nCap;
        uVar5 = pVVar2->nSize;
        cVar4 = '\x02';
        if (uVar5 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar2->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(0x10);
            }
            else {
              pcVar3 = (char *)realloc(pVVar2->pArray,0x10);
            }
            cVar4 = '\x02';
            goto LAB_003ff783;
          }
          __size = (ulong)uVar1 * 2;
          if ((int)__size <= (int)uVar1) break;
          if (pVVar2->pArray == (char *)0x0) {
            pcVar3 = (char *)malloc(__size);
          }
          else {
            pcVar3 = (char *)realloc(pVVar2->pArray,__size);
          }
          cVar4 = '\x02';
          goto LAB_003ff7a1;
        }
        break;
      default:
        if (*pBuffer == '~') {
          if (Type < PLA_FILE_FR) goto switchD_003ff5bc_caseD_30;
          if (Type == PLA_FILE_FDR) {
            uVar1 = pVVar2->nCap;
            uVar5 = pVVar2->nSize;
            cVar4 = '\x03';
            if (uVar5 == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar2->pArray == (char *)0x0) {
                  pcVar3 = (char *)malloc(0x10);
                }
                else {
                  pcVar3 = (char *)realloc(pVVar2->pArray,0x10);
                }
                cVar4 = '\x03';
                goto LAB_003ff783;
              }
              __size = (ulong)uVar1 * 2;
              if ((int)uVar1 < (int)__size) {
                if (pVVar2->pArray == (char *)0x0) {
                  pcVar3 = (char *)malloc(__size);
                }
                else {
                  pcVar3 = (char *)realloc(pVVar2->pArray,__size);
                }
                cVar4 = '\x03';
                goto LAB_003ff7a1;
              }
            }
            break;
          }
          if (Type != PLA_FILE_FR) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/pla/plaRead.c"
                          ,0x98,"Vec_Str_t *Pla_ReadPlaBody(char *, char *, Pla_File_t)");
          }
          goto switchD_003ff5bc_caseD_2d;
        }
        goto switchD_003ff5bc_caseD_2e;
      }
      pVVar2->nSize = uVar5 + 1;
      pVVar2->pArray[(int)uVar5] = cVar4;
switchD_003ff5bc_caseD_2e:
      pBuffer = pBuffer + 1;
    } while (pBuffer < pLimit);
  }
  return pVVar2;
}

Assistant:

Vec_Str_t * Pla_ReadPlaBody( char * pBuffer, char * pLimit, Pla_File_t Type )
{
    char * pTemp;
    Vec_Str_t * vLits;
    vLits = Vec_StrAlloc( 10000 );
    for ( pTemp = pBuffer; pTemp < pLimit; pTemp++ )
    {
        if ( *pTemp == '.' )
            while ( *pTemp && *pTemp != '\n' )
                pTemp++;
        if ( *pTemp == '0' )
            Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
        else if ( *pTemp == '1' )
            Vec_StrPush( vLits, (char)PLA_LIT_ONE );
        else if ( *pTemp == '-' || *pTemp == '2' )
            Vec_StrPush( vLits, (char)PLA_LIT_DASH );
        else if ( *pTemp == '~' ) // no meaning
        {
            if ( Type == PLA_FILE_F || Type == PLA_FILE_FD )
                Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
            else if ( Type == PLA_FILE_FR )
                Vec_StrPush( vLits, (char)PLA_LIT_DASH );
            else if ( Type == PLA_FILE_FDR )
                Vec_StrPush( vLits, (char)PLA_LIT_FULL );
            else assert( 0 );
        }
    }
    return vLits;
}